

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterio.cpp
# Opt level: O0

void anon_unknown.dwarf_8d21::WriteOneParameter(FILE *fp,char *text,double parameter,int size)

{
  int local_28;
  int local_24;
  int parameter_int;
  int size_local;
  double parameter_local;
  char *text_local;
  FILE *fp_local;
  
  local_24 = size;
  _parameter_int = parameter;
  parameter_local = (double)text;
  text_local = (char *)fp;
  fwrite(text,1,4,(FILE *)fp);
  if (local_24 == 4) {
    local_28 = (int)_parameter_int;
    fwrite(&local_28,4,1,(FILE *)text_local);
  }
  else {
    fwrite(&parameter_int,8,1,(FILE *)text_local);
  }
  return;
}

Assistant:

static void WriteOneParameter(FILE *fp, const char *text,
    double parameter, int size) {
  fwrite(text, 1, 4, fp);
  if (size == 4) {
    int parameter_int = static_cast<int>(parameter);
    fwrite(&parameter_int, 4, 1, fp);
  } else {
    fwrite(&parameter, 8, 1, fp);
  }
}